

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall
TEST_WiningStateTest_EarthlyHand_Test::~TEST_WiningStateTest_EarthlyHand_Test
          (TEST_WiningStateTest_EarthlyHand_Test *this)

{
  TEST_WiningStateTest_EarthlyHand_Test *mem;
  TEST_WiningStateTest_EarthlyHand_Test *this_local;
  
  mem = this;
  ~TEST_WiningStateTest_EarthlyHand_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(WiningStateTest, EarthlyHand)
{
	s.setSeatWind(Tile::SouthWind);

	addNoWiningHand();

	SelfDrawnSituation situation;
	situation.is_uninterrupted_first_drawn = true;

	selfDrawn(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::EarthlyHand));
	CHECK_EQUAL(100, r.doubling_factor);
}